

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsBlurEffect::setBlurRadius(QGraphicsBlurEffect *this,qreal radius)

{
  bool bVar1;
  QGraphicsEffect *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  QGraphicsBlurEffectPrivate *d;
  qreal in_stack_ffffffffffffffd8;
  
  d_func((QGraphicsBlurEffect *)0x4a4672);
  QPixmapBlurFilter::radius((QPixmapBlurFilter *)in_RDI);
  bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    QPixmapBlurFilter::setRadius((QPixmapBlurFilter *)in_RDI,in_stack_ffffffffffffffd8);
    QGraphicsEffect::updateBoundingRect(in_RDI);
    blurRadiusChanged((QGraphicsBlurEffect *)0x4a46cc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGraphicsBlurEffect::setBlurRadius(qreal radius)
{
    Q_D(QGraphicsBlurEffect);
    if (qFuzzyCompare(d->filter->radius(), radius))
        return;

    d->filter->setRadius(radius);
    updateBoundingRect();
    emit blurRadiusChanged(radius);
}